

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O2

PCF_Property pcf_find_property(PCF_Face face,FT_String *prop)

{
  PCF_Property pPVar1;
  int iVar2;
  int iVar3;
  PCF_Property pPVar4;
  long lVar5;
  bool bVar6;
  
  iVar2 = face->nprops;
  pPVar4 = face->properties + -1;
  lVar5 = 0;
  bVar6 = false;
  while ((lVar5 < iVar2 && (!bVar6))) {
    pPVar1 = pPVar4 + 1;
    pPVar4 = pPVar4 + 1;
    iVar3 = strcmp(pPVar1->name,prop);
    lVar5 = lVar5 + 1;
    bVar6 = iVar3 == 0;
  }
  if (!bVar6) {
    pPVar4 = (PCF_Property)0x0;
  }
  return pPVar4;
}

Assistant:

FT_LOCAL_DEF( PCF_Property )
  pcf_find_property( PCF_Face          face,
                     const FT_String*  prop )
  {
    PCF_Property  properties = face->properties;
    FT_Bool       found      = 0;
    int           i;


    for ( i = 0; i < face->nprops && !found; i++ )
    {
      if ( !ft_strcmp( properties[i].name, prop ) )
        found = 1;
    }

    if ( found )
      return properties + i - 1;
    else
      return NULL;
  }